

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O3

HRESULT __thiscall Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(Utf8SourceInfo *this)

{
  AutoNestedHandledExceptionType local_1c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((this->m_lineOffsetCache).ptr == (LineOffsetCache *)0x0) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_1c,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                        ExceptionType_OutOfMemory);
    EnsureLineOffsetCache(this);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_1c);
  }
  return 0;
}

Assistant:

HRESULT Utf8SourceInfo::EnsureLineOffsetCacheNoThrow()
    {
        HRESULT hr = S_OK;
        // This is a double check, otherwise we would have to have a private function, and add an assert.
        // Basically the outer check is for try/catch, inner check (inside EnsureLineOffsetCache) is for that method as its public.
        if (this->m_lineOffsetCache == nullptr)
        {
            BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
            {
                this->EnsureLineOffsetCache();
            }
            END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NOASSERT(hr);
        }